

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::
     PrintWithFallback<std::unordered_set<short,std::hash<short>,std::equal_to<short>,std::allocator<short>>>
               (unordered_set<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_>
                *value,ostream *os)

{
  ostream *os_local;
  unordered_set<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_> *value_local;
  
  ContainerPrinter::
  PrintValue<std::unordered_set<short,std::hash<short>,std::equal_to<short>,std::allocator<short>>,void>
            (value,os);
  return;
}

Assistant:

void PrintWithFallback(const T& value, ::std::ostream* os) {
  using Printer = typename FindFirstPrinter<
      T, void, ContainerPrinter, FunctionPointerPrinter, PointerPrinter,
      internal_stream_operator_without_lexical_name_lookup::StreamPrinter,
      ProtobufPrinter, ConvertibleToIntegerPrinter,
      ConvertibleToStringViewPrinter, RawBytesPrinter, FallbackPrinter>::type;
  Printer::PrintValue(value, os);
}